

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test264.c
# Opt level: O2

int main(int argc,char **argv)

{
  h264_macroblock *phVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  FILE *pFVar7;
  bitstream *pbVar8;
  h264_seqparm *phVar9;
  h264_picparm *phVar10;
  h264_slice *slice;
  h264_macroblock *phVar11;
  int32_t (*paaiVar12) [8] [15];
  uint32_t uVar13;
  int32_t (*paaiVar14) [16] [16];
  int32_t (*paaiVar15) [16] [15];
  uint32_t *puVar16;
  long lVar17;
  uint32_t *puVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  int32_t *piVar23;
  uint32_t *puVar24;
  uint32_t *puVar25;
  uint32_t (*pauVar26) [4];
  ulong uVar27;
  int32_t *piVar28;
  long lVar29;
  uint32_t val;
  uint32_t (*local_78) [4];
  int32_t (*local_70) [16] [15];
  int32_t (*local_68) [8] [15];
  int32_t (*local_60) [16] [16];
  int32_t (*local_58) [8];
  int32_t (*local_50) [4] [64];
  FILE *local_48;
  h264_slice *local_40;
  bitstream *local_38;
  
  if (argc < 2) {
    pFVar7 = (FILE *)0x0;
  }
  else {
    pFVar7 = fopen(argv[1],"w");
    if (pFVar7 == (FILE *)0x0) {
      perror("fopen");
      return 1;
    }
  }
  pbVar8 = vs_new_encode(VS_H264);
  val = 0xde;
  iVar5 = vs_start(pbVar8,&val);
  if (iVar5 == 0) {
    local_48 = pFVar7;
    local_38 = pbVar8;
    phVar9 = (h264_seqparm *)calloc(0xcd8,1);
    phVar10 = (h264_picparm *)calloc(0x8a8,1);
    slice = (h264_slice *)calloc(0xc48,1);
    phVar10->transform_8x8_mode_flag = 1;
    phVar10->entropy_coding_mode_flag = 1;
    slice->seqparm = phVar9;
    slice->picparm = phVar10;
    slice->pic_width_in_mbs = 8;
    slice->pic_size_in_mbs = 0xc0;
    slice->sliceqpy = 0x1a;
    slice->nal_unit_type = 1;
    slice->field_pic_flag = 1;
    slice->cabac_init_idc = 2;
    slice->chroma_array_type = 1;
    slice->num_ref_idx_l0_active_minus1 = 0x1f;
    slice->num_ref_idx_l1_active_minus1 = 0x1f;
    phVar11 = (h264_macroblock *)calloc(0x3774,0xc0);
    pbVar8 = local_38;
    slice->mbs = phVar11;
    piVar28 = phVar11->mvd[0][0] + 1;
    pauVar26 = phVar11->ref_idx;
    puVar24 = phVar11->rem_intra4x4_pred_mode;
    puVar25 = phVar11->rem_intra8x8_pred_mode;
    puVar18 = phVar11->pcm_sample_chroma;
    local_70 = phVar11->block_luma_ac;
    local_50 = phVar11->block_luma_8x8;
    local_60 = phVar11->block_luma_4x4;
    local_58 = phVar11->block_chroma_dc;
    local_68 = phVar11->block_chroma_ac;
    for (uVar27 = 0; uVar27 != 0x60; uVar27 = uVar27 + 1) {
      uVar2 = (uint)(uVar27 >> 2);
      phVar1 = phVar11 + uVar27;
      phVar11[uVar27].mb_field_decoding_flag = uVar2 & 1;
      uVar3 = (uint)uVar27;
      uVar20 = (uVar3 * 3 & 0xffff) % 0x30;
      puVar16 = &phVar11[uVar27].coded_block_pattern;
      phVar11[uVar27].coded_block_pattern = uVar20;
      phVar11[uVar27].transform_size_8x8_flag = uVar3 & 1;
      phVar11[uVar27].mb_qp_delta = (byte)(((ushort)uVar27 & 0xff) % 5) - 2;
      if (uVar27 < 0x10) {
        phVar11[uVar27].mb_type = 0;
        uVar6 = 0;
LAB_001023e9:
        for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
          puVar24[uVar22 - 0x10] = (uint)uVar22 & 1;
          puVar24[uVar22] = (uint)(uVar22 >> 1) & 0x7fffffff;
        }
        for (uVar22 = 0; uVar22 != 4; uVar22 = uVar22 + 1) {
          puVar25[uVar22 - 4] = (uint)uVar22 & 1;
          puVar25[uVar22] = (uint)(uVar22 >> 1) & 0x7fffffff;
        }
LAB_00102448:
        if (uVar6 < 0x1b) {
LAB_00102476:
          phVar1->intra_chroma_pred_mode = uVar2 & 3;
        }
        if (uVar6 == 0x19) {
          phVar1->coded_block_pattern = 0x2f;
          phVar11[uVar27].transform_size_8x8_flag = 0;
          phVar11[uVar27].mb_qp_delta = 0;
          phVar11[uVar27].intra_chroma_pred_mode = 0;
          for (lVar29 = 0; lVar29 != 0x100; lVar29 = lVar29 + 1) {
            if ((uVar27 & 1) != 0) {
              puVar18[lVar29] = (uint32_t)lVar29;
            }
            if ((uVar27 & 2) != 0) {
              puVar18[lVar29 + -0x100] = (uint32_t)lVar29;
            }
          }
        }
        else {
          if ((uVar6 == 0x38) || (uVar6 == 0x20)) goto LAB_00102497;
          if (uVar6 - 0x19 < 0xffffffe8) {
LAB_0010253e:
            if ((short)uVar20 == 0) {
              phVar1->mb_qp_delta = 0;
            }
            iVar5 = 0;
            paaiVar14 = local_60;
            for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
              if ((*puVar16 >> ((uint)(uVar22 >> 2) & 0x1f) & 1) != 0) {
                for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
                  if (uVar22 != 0) {
                    iVar19 = iVar5 + (int)lVar29;
                    (*paaiVar14)[0][lVar29] = iVar19;
                    *(int *)((long)(*local_50)[0] +
                            lVar29 * 4 +
                            ((ulong)(((uint)uVar22 & 3) << 6) | (uVar22 & 0xfffffffffffffffc) << 6))
                         = iVar19;
                  }
                }
              }
              paaiVar14 = (int32_t (*) [16] [16])(*paaiVar14 + 1);
              iVar5 = iVar5 + 0x10;
            }
          }
          else {
            uVar20 = uVar6 * 4 - 4 & 0xfffffff0;
            uVar4 = uVar20 - 0x30;
            if (uVar6 - 1 < 0xc) {
              uVar4 = uVar20;
            }
            uVar13 = uVar4 + 0xf;
            if (uVar6 < 0xd) {
              uVar13 = uVar4;
            }
            *puVar16 = uVar13;
            phVar11[uVar27].transform_size_8x8_flag = 0;
            iVar5 = 1;
            paaiVar15 = local_70;
            for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
              phVar11[uVar27].block_luma_dc[0][uVar22] = (uint)uVar22 | 0x100;
              if ((*puVar16 >> ((uint)(uVar22 >> 2) & 0x1f) & 1) != 0) {
                for (lVar29 = 0; lVar29 != 0xf; lVar29 = lVar29 + 1) {
                  if (uVar22 != 0) {
                    (*paaiVar15)[0][lVar29] = iVar5 + (int)lVar29;
                  }
                }
              }
              iVar5 = iVar5 + 0x10;
              paaiVar15 = (int32_t (*) [16] [15])(*paaiVar15 + 1);
            }
          }
          uVar20 = *puVar16;
          if ((uVar20 & 0x30) != 0) {
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              *(uint *)((long)*local_58 + lVar29 * 4 + (ulong)((uVar3 & 1) << 5)) =
                   (uint)lVar29 | 0xfffffff0;
            }
          }
          local_78 = pauVar26;
          if ((uVar20 & 0x20) != 0) {
            paaiVar12 = local_68 + ((uint)(uVar27 >> 1) & 1);
            iVar5 = 0;
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              for (lVar17 = 0; lVar17 != 0xf; lVar17 = lVar17 + 1) {
                if (lVar29 != 1) {
                  (*paaiVar12)[0][lVar17] = iVar5 + (int)lVar17 | 0xfffff000;
                }
              }
              iVar5 = iVar5 + 0x100;
              paaiVar12 = (int32_t (*) [8] [15])(*paaiVar12 + 1);
            }
          }
        }
      }
      else {
        if (uVar27 < 0x28) {
          uVar6 = uVar3 - 0xf;
          phVar11[uVar27].mb_type = uVar6;
LAB_0010243f:
          if ((uVar6 == 0x1a) || (uVar6 == 0)) goto LAB_001023e9;
          goto LAB_00102448;
        }
        if (uVar27 < 0x2c) {
          phVar11[uVar27].mb_type = 0x19;
          uVar6 = 0x19;
          goto LAB_00102476;
        }
        if (0x2f < uVar27) {
          if (uVar27 < 0x48) {
            uVar21 = uVar3 - 0x30 >> 3;
            uVar6 = uVar21 + 0x1b;
            phVar11[uVar27].mb_type = uVar6;
            if (uVar3 - 0x30 < 8) {
              for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
                (*pauVar26)[lVar29] = (uVar3 & 7) + 0xf;
              }
              for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
                piVar28[lVar29 * 2 + -1] = -3 - (uVar3 & 7);
                piVar28[lVar29 * 2] = uVar3 & 3;
              }
            }
            else if (uVar21 == 1) {
              for (uVar22 = 0; uVar22 != 4; uVar22 = uVar22 + 1) {
                (*pauVar26)[uVar22] = (uint)(uVar22 >> 1) & 0x7fffffff | 4;
              }
              for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
                uVar21 = (uint)(uVar22 >> 3) & 0x1fffffff;
                piVar28[uVar22 * 2 + -1] = uVar21 | 0xc;
                piVar28[uVar22 * 2] = -uVar21;
              }
            }
            else {
              for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
                (*pauVar26)[lVar29] = (uint)lVar29 | 2;
              }
              for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
                piVar28[uVar22 * 2 + -1] = (uint)(uVar22 >> 2) & 0x3fffffff | 6;
                piVar28[uVar22 * 2] = -(uint)(((uint)uVar22 >> 2 & 1) != 0);
              }
            }
            goto LAB_0010243f;
          }
          phVar11[uVar27].mb_type = 0x1e;
          phVar11[uVar27].transform_size_8x8_flag = 0;
          lVar29 = 0;
          piVar23 = piVar28;
          while (lVar29 != 4) {
            phVar1->sub_mb_type[lVar29] = (uint32_t)lVar29;
            phVar11[uVar27].ref_idx[0][lVar29] = (uint32_t)(lVar29 + 1);
            uVar2 = (&DAT_0010b020)[lVar29];
            iVar5 = (uint32_t)lVar29 * 4;
            for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
              uVar6 = uVar2 & (uint)lVar17;
              piVar23[lVar17 * 2 + -1] = iVar5 + uVar6 + 0x10;
              piVar23[lVar17 * 2] = uVar6 + iVar5 + -0x20;
            }
            piVar23 = piVar23 + 8;
            lVar29 = lVar29 + 1;
          }
          goto LAB_0010253e;
        }
        phVar11[uVar27].mb_type = 0x20;
LAB_00102497:
        *puVar16 = 0;
        phVar11[uVar27].transform_size_8x8_flag = 0;
        phVar11[uVar27].mb_qp_delta = 0;
        phVar11[uVar27].intra_chroma_pred_mode = 0;
      }
      phVar1->mb_field_decoding_flag = 1;
      piVar28 = piVar28 + 0xddd;
      pauVar26 = (uint32_t (*) [4])((long)(pauVar26 + 0x377) + 4);
      puVar24 = puVar24 + 0xddd;
      puVar25 = puVar25 + 0xddd;
      puVar18 = puVar18 + 0xddd;
      local_70 = (int32_t (*) [16] [15])((long)(local_70 + 0xe) + 0x2f4);
      local_50 = (int32_t (*) [4] [64])((long)(local_50 + 0xd) + 0x374);
      local_60 = (int32_t (*) [16] [16])((long)(local_60 + 0xd) + 0x374);
      local_58 = (int32_t (*) [8])((long)(local_58 + 0x1bb) + 0x14);
      local_68 = (int32_t (*) [8] [15])((long)(local_68 + 0x1d) + 0x114);
    }
    slice->last_mb_in_slice = 0x5f;
    local_40 = slice;
    iVar5 = h264_slice_data(local_38,slice);
    if (iVar5 == 0) {
      if (local_48 != (FILE *)0x0) {
        fwrite(pbVar8->bytes,(long)pbVar8->bytesnum,1,local_48);
      }
      pbVar8 = vs_new_decode(VS_H264,pbVar8->bytes,pbVar8->bytesnum);
      iVar5 = vs_start(pbVar8,&val);
      if (iVar5 == 0) {
        if (val == 0xde) {
          iVar5 = h264_slice_data(pbVar8,slice);
          h264_print_slice_data(slice);
          if (iVar5 == 0) {
            fwrite("All ok!\n",8,1,_stderr);
            return 0;
          }
          return 1;
        }
        fwrite("Fail 1\n",7,1,_stderr);
      }
    }
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	FILE *out = 0;
	if (argc >= 2) {
		out = fopen(argv[1], "w");
		if (!out) {
			perror("fopen");
			return 1;
		}
	}
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;

	struct h264_seqparm *seqparm = calloc(sizeof *seqparm, 1);
	struct h264_picparm *picparm = calloc(sizeof *picparm, 1);
	struct h264_slice *slice = calloc(sizeof *slice, 1);
	seqparm->frame_mbs_only_flag = 0;
	seqparm->direct_8x8_inference_flag = 0;
	picparm->num_slice_groups_minus1 = 0;
	picparm->constrained_intra_pred_flag = 0;
	picparm->transform_8x8_mode_flag = 1;
	picparm->entropy_coding_mode_flag = 1;
	slice->seqparm = seqparm;
	slice->picparm = picparm;
	slice->sliceqpy = 26;
	slice->pic_width_in_mbs = 8;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * 24;
	slice->first_mb_in_slice = 0;
	slice->nal_unit_type = 1;
	slice->slice_type = H264_SLICE_TYPE_P;
	slice->mbaff_frame_flag = 0;
	slice->field_pic_flag = 1;
	slice->cabac_init_idc = 2;
	slice->chroma_array_type = 1;
	slice->num_ref_idx_l0_active_minus1 = 31;
	slice->num_ref_idx_l1_active_minus1 = 31;
	slice->bit_depth_luma_minus8 = 0;
	slice->bit_depth_chroma_minus8 = 0;
	slice->mbs = calloc(sizeof *slice->mbs, slice->pic_size_in_mbs);
	int i, j, k;
	for (i = 0; i < 96; i++) {
		slice->mbs[i].mb_field_decoding_flag = i >> 2 & 1;
		slice->mbs[i].coded_block_pattern = i * 3 % 48;
		slice->mbs[i].transform_size_8x8_flag = i& 1;
		slice->mbs[i].mb_qp_delta = (i%5) - 2;
		if (i < 16) {
			slice->mbs[i].mb_type = 0;
		} else if (i < 40) {
			slice->mbs[i].mb_type = 1 + (i- 16);
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_P) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_SKIP;
			} else if (i < 72) {
				int x = (i - 48)/8;
				slice->mbs[i].mb_type = H264_MB_TYPE_P_L0_16X16 + x;
				if (x == 0) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 15 + (i & 7);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = -((i & 7) + 3);
						slice->mbs[i].mvd[0][j][1] = (i&3);
					}
				} else if (x == 1) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 4 + (j >> 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 12 + (j >> 3);
						slice->mbs[i].mvd[0][j][1] = -(j >> 3);
					}
				} else if (x == 2) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 2 + (j & 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 6 + (j>>2 & 1);
						slice->mbs[i].mvd[0][j][1] = -(j>>2 & 1);
					}
				}
			} else {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_8X8;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 4; j++) {
					slice->mbs[i].sub_mb_type[j] = j;
					slice->mbs[i].ref_idx[0][j] = j+1;
					int tt[4] = { 0, 2, 1, 3};
					for (k = 0; k < 4; k++) {
						int kk = j * 4 + (k & j[tt]);
						slice->mbs[i].mvd[0][j*4+k][0] = 16+kk;
						slice->mbs[i].mvd[0][j*4+k][1] = kk - 32;;
					}
				}
			}
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_B) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else if (i < 72) {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			}
		} else {
			slice->mbs[i].mb_type = H264_MB_TYPE_I_PCM;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_I_NXN || slice->mbs[i].mb_type == H264_MB_TYPE_SI) {
			for (j = 0; j < 16; j++) {
				slice->mbs[i].prev_intra4x4_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra4x4_pred_mode[j] = j >> 1;
			}
			for (j = 0; j < 4; j++) {
				slice->mbs[i].prev_intra8x8_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra8x8_pred_mode[j] = j >> 1;
			}
		}
		if (slice->mbs[i].mb_type < H264_MB_TYPE_P_BASE) {
			slice->mbs[i].intra_chroma_pred_mode = i >> 2 & 3;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_P_SKIP || slice->mbs[i].mb_type == H264_MB_TYPE_B_SKIP) {
			slice->mbs[i].mb_field_decoding_flag = 0;
			slice->mbs[i].coded_block_pattern = 0;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
		} else if (slice->mbs[i].mb_type == H264_MB_TYPE_I_PCM) {
			slice->mbs[i].coded_block_pattern = 0x2f;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
			for (j = 0; j < 256; j++) {
				if (i & 1)
					slice->mbs[i].pcm_sample_chroma[j] = j;
				if (i & 2)
					slice->mbs[i].pcm_sample_luma[j] = j;
			}
		} else {
			if (h264_is_intra_16x16_mb_type(slice->mbs[i].mb_type)) {
				int mbt = slice->mbs[i].mb_type;
				int infer_cbp = (((mbt - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
				if (mbt >= H264_MB_TYPE_I_16X16_0_0_1)
					infer_cbp |= 0xf;
				slice->mbs[i].coded_block_pattern = infer_cbp;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 16; j++) {
					slice->mbs[i].block_luma_dc[0][j] = 0x100 + j;
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 15; k++) {
							if (j) {
								slice->mbs[i].block_luma_ac[0][j][k] = j * 16 + k + 1;
							}
						}
					}
				}
			} else {
				if (!slice->mbs[i].coded_block_pattern)
					slice->mbs[i].mb_qp_delta = 0;
				for (j = 0; j < 16; j++) {
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 16; k++) {
							if (j) {
								slice->mbs[i].block_luma_4x4[0][j][k] = j * 16 + k;
								slice->mbs[i].block_luma_8x8[0][j>>2][(j&3)*16+k] = j*16 + k;
							}
						}
					}
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x30) {
				for (k = 0; k < 4; k++) {
					slice->mbs[i].block_chroma_dc[i&1][k] = -0x10 + k;
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x20) {
				for (j = 0; j < 4; j++) {
					for (k = 0; k < 15; k++) {
						if (j != 1)
							slice->mbs[i].block_chroma_ac[i>>1&1][j][k] = k - 0x1000 + j * 0x100;
					}
				}
			}
		}
		if (!slice->mbaff_frame_flag)
			slice->mbs[i].mb_field_decoding_flag = slice->field_pic_flag;
	}
	slice->last_mb_in_slice = i - 1;
	
	if (h264_slice_data(str, slice)) return 1;

	if (out)
		fwrite(str->bytes, str->bytesnum, 1, out);

	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}
	if (h264_slice_data(nstr, slice)) {
		h264_print_slice_data(slice);
		return 1;
	}
	h264_print_slice_data(slice);

	fprintf (stderr, "All ok!\n");

	return 0;
}